

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

AssertionResult __thiscall
testing::internal::EqFailure
          (internal *this,char *expected_expression,char *actual_expression,String *expected_value,
          String *actual_value,bool ignoring_case)

{
  char cVar1;
  AssertionResult *pAVar2;
  bool bVar3;
  size_t sVar4;
  AssertionResult *other;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar5
  ;
  size_t sVar6;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar7;
  char *pcVar8;
  ostream *poVar9;
  undefined3 in_register_00000089;
  AssertionResult AVar10;
  Message msg;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  undefined4 local_54;
  char *local_50;
  AssertionResult local_48;
  AssertionResult *local_38;
  
  local_54 = CONCAT31(in_register_00000089,ignoring_case);
  local_50 = expected_expression;
  local_38 = (AssertionResult *)this;
  Message::Message((Message *)&local_60);
  poVar9 = (ostream *)(local_60.ptr_ + 0x10);
  if (local_60.ptr_ ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    poVar9 = (ostream *)0x0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"Value of: ",10);
  if (actual_expression == (char *)0x0) {
    sVar7.ptr_ = local_60.ptr_ + 0x10;
    sVar4 = 6;
    pcVar8 = "(null)";
  }
  else {
    sVar7.ptr_ = local_60.ptr_;
    if (local_60.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      sVar7.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_60.ptr_ + 0x10);
    }
    sVar4 = strlen(actual_expression);
    pcVar8 = actual_expression;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)sVar7.ptr_,pcVar8,sVar4);
  bVar3 = String::operator==(actual_value,actual_expression);
  if (!bVar3) {
    poVar9 = (ostream *)(local_60.ptr_ + 0x10);
    if (local_60.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar9 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n  Actual: ",0xb);
    poVar9 = (ostream *)(local_60.ptr_ + 0x10);
    if (local_60.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar9 = (ostream *)0x0;
    }
    pcVar8 = actual_value->c_str_;
    if (pcVar8 == (char *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"(null)",6);
    }
    else if (actual_value->length_ != 0) {
      sVar6 = 0;
      do {
        cVar1 = pcVar8[sVar6];
        if (cVar1 == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\\0",2);
        }
        else {
          local_48.success_ = (bool)cVar1;
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_48.success_,1);
        }
        sVar6 = sVar6 + 1;
      } while (sVar6 != actual_value->length_);
    }
  }
  poVar9 = (ostream *)(local_60.ptr_ + 0x10);
  if (local_60.ptr_ ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    poVar9 = (ostream *)0x0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\nExpected: ",0xb);
  pcVar8 = local_50;
  if (local_50 == (char *)0x0) {
    sVar7.ptr_ = local_60.ptr_ + 0x10;
    sVar4 = 6;
    pcVar8 = "(null)";
  }
  else {
    sVar7.ptr_ = local_60.ptr_;
    if (local_60.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      sVar7.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_60.ptr_ + 0x10);
    }
    sVar4 = strlen(local_50);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)sVar7.ptr_,pcVar8,sVar4);
  if ((char)local_54 != '\0') {
    poVar9 = (ostream *)(local_60.ptr_ + 0x10);
    if (local_60.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar9 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," (ignoring case)",0x10);
  }
  bVar3 = String::operator==(expected_value,local_50);
  if (!bVar3) {
    poVar9 = (ostream *)(local_60.ptr_ + 0x10);
    if (local_60.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar9 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\nWhich is: ",0xb);
    poVar9 = (ostream *)(local_60.ptr_ + 0x10);
    if (local_60.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar9 = (ostream *)0x0;
    }
    pcVar8 = expected_value->c_str_;
    if (pcVar8 == (char *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"(null)",6);
    }
    else if (expected_value->length_ != 0) {
      sVar6 = 0;
      do {
        cVar1 = pcVar8[sVar6];
        if (cVar1 == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\\0",2);
        }
        else {
          local_48.success_ = (bool)cVar1;
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_48.success_,1);
        }
        sVar6 = sVar6 + 1;
      } while (sVar6 != expected_value->length_);
    }
  }
  local_48.success_ = false;
  local_48.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  other = AssertionResult::operator<<(&local_48,(Message *)&local_60);
  pAVar2 = local_38;
  AssertionResult::AssertionResult(local_38,other);
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  sVar5.ptr_ = extraout_RDX;
  if (local_60.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_60.ptr_ + 8))();
    sVar5.ptr_ = extraout_RDX_00;
  }
  AVar10.message_.ptr_ = sVar5.ptr_;
  AVar10._0_8_ = pAVar2;
  return AVar10;
}

Assistant:

AssertionResult EqFailure(const char* expected_expression,
                          const char* actual_expression,
                          const String& expected_value,
                          const String& actual_value,
                          bool ignoring_case) {
  Message msg;
  msg << "Value of: " << actual_expression;
  if (actual_value != actual_expression) {
    msg << "\n  Actual: " << actual_value;
  }

  msg << "\nExpected: " << expected_expression;
  if (ignoring_case) {
    msg << " (ignoring case)";
  }
  if (expected_value != expected_expression) {
    msg << "\nWhich is: " << expected_value;
  }

  return AssertionFailure() << msg;
}